

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

TArray<FString,_FString> * __thiscall
TArray<FString,_FString>::operator=(TArray<FString,_FString> *this,TArray<FString,_FString> *other)

{
  uint uVar1;
  FString *block;
  
  block = this->Array;
  if (block != (FString *)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
      block = this->Array;
    }
    M_Free(block);
  }
  this->Array = other->Array;
  other->Array = (FString *)0x0;
  uVar1 = other->Count;
  this->Most = other->Most;
  this->Count = uVar1;
  other->Most = 0;
  other->Count = 0;
  return this;
}

Assistant:

TArray<T,TT> &operator= (TArray<T,TT> &&other)
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
		}
		Array = other.Array; other.Array = NULL;
		Most = other.Most; other.Most = 0;
		Count = other.Count; other.Count = 0;
		return *this;
	}